

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int on_ack_max_data(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent
                   )

{
  quicly_sent_t *pqVar1;
  st_quicly_sent_block_t *psVar2;
  
  if (acked == 0) {
    psVar2 = map[-5].head;
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x80,
                    "void quicly_maxsender_lost(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
  }
  else {
    pqVar1 = (quicly_sent_t *)((sent->data).packet.packet_number >> 1);
    if ((long)map[-6]._pending_packet < (long)pqVar1) {
      map[-6]._pending_packet = pqVar1;
    }
    if ((undefined1  [24])((undefined1  [24])sent->data & (undefined1  [24])0x1) ==
        (undefined1  [24])0x0) {
      return 0;
    }
    psVar2 = map[-5].head;
    if (psVar2 == (st_quicly_sent_block_t *)0x0) {
      __assert_fail("m->num_inflight != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                    ,0x77,
                    "void quicly_maxsender_acked(quicly_maxsender_t *, quicly_maxsender_sent_t *)");
    }
  }
  map[-5].head = (st_quicly_sent_block_t *)((long)&psVar2[-1].entries[0xf].data + 0x17);
  *(byte *)&sent->data = *(byte *)&sent->data & 0xfe;
  return 0;
}

Assistant:

static int on_ack_max_data(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));

    if (acked) {
        quicly_maxsender_acked(&conn->ingress.max_data.sender, &sent->data.max_data.args);
    } else {
        quicly_maxsender_lost(&conn->ingress.max_data.sender, &sent->data.max_data.args);
    }

    return 0;
}